

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::GetRawRepeatedField
          (ExtensionSet *this,int number,void *default_value)

{
  Extension *pEVar1;
  Extension *extension;
  void *default_value_local;
  int number_local;
  ExtensionSet *this_local;
  
  pEVar1 = FindOrNull(this,number);
  this_local = (ExtensionSet *)default_value;
  if (pEVar1 != (Extension *)0x0) {
    this_local = *(ExtensionSet **)&pEVar1->field_0;
  }
  return this_local;
}

Assistant:

const void* ExtensionSet::GetRawRepeatedField(int number,
                                              const void* default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    return default_value;
  }
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->ptr.repeated_int32_t_value;
}